

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<Js::JavascriptLibrary::JsrtExternalCallbacks>
          (BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
           *this,JsrtExternalCallbacks *key,RecyclerWeakReference<Js::DynamicType> **value)

{
  int iVar1;
  WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
  **ppWVar2;
  WriteBarrierPtr *this_00;
  RecyclerWeakReference<Js::DynamicType> **ppRVar3;
  int i;
  RecyclerWeakReference<Js::DynamicType> **value_local;
  JsrtExternalCallbacks *key_local;
  BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<Js::JavascriptLibrary::JsrtExternalCallbacks>(this,key);
  if (-1 < iVar1) {
    ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefValueDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    this_00 = (WriteBarrierPtr *)
              anon_unknown_4::
              ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
              ::Value((ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
                       *)(*ppWVar2 + iVar1));
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__(this_00);
    *value = *ppRVar3;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }